

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

CompressionFunction * duckdb::RoaringCompressionFun::GetFunction(PhysicalType type)

{
  InternalException *this;
  char in_SIL;
  CompressionFunction *in_RDI;
  PhysicalType in_stack_00000037;
  string *in_stack_ffffffffffffff98;
  allocator local_29;
  string local_28 [40];
  
  if (in_SIL == -0x32) {
    GetCompressionFunction(in_stack_00000037);
    return in_RDI;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_28,"Unsupported type for Roaring",&local_29);
  InternalException::InternalException(this,in_stack_ffffffffffffff98);
  __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

CompressionFunction RoaringCompressionFun::GetFunction(PhysicalType type) {
	switch (type) {
	case PhysicalType::BIT:
		return GetCompressionFunction(type);
	default:
		throw InternalException("Unsupported type for Roaring");
	}
}